

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isubd-cc.cpp
# Opt level: O0

void mouseMotionCallback(GLFWwindow *window,double x,double y)

{
  undefined8 uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  vec3 *pvVar7;
  float_t fVar8;
  vec3 vVar9;
  vec3 local_200;
  vec3 local_1f0;
  vec3 local_1e4;
  vec3 local_1d8;
  vec3 local_1c8;
  vec3 local_1b8;
  vec3 local_1a8;
  vec3 local_198;
  vec3 local_188;
  undefined1 local_17c [8];
  mat3 axis_1;
  mat3 local_f8;
  mat3 local_d4;
  vec3 local_b0;
  mat3 local_a4;
  mat3 local_80;
  undefined1 local_5c [8];
  mat3 axis;
  ImGuiIO *io;
  double dy;
  double dx;
  double y_local;
  double x_local;
  GLFWwindow *window_local;
  
  dVar2 = x - mouseMotionCallback::x0;
  dVar3 = y - mouseMotionCallback::y0;
  axis.m[2]._4_8_ = ImGui::GetIO();
  dVar4 = mouseMotionCallback::x0;
  dVar5 = mouseMotionCallback::y0;
  if ((((ImGuiIO *)axis.m[2]._4_8_)->WantCaptureMouse & 1U) == 0) {
    iVar6 = glfwGetMouseButton(window,0);
    if (iVar6 == 1) {
      dja::transpose((mat3 *)local_5c,&g_camera.axis);
      dja::vec3::vec3(&local_b0,0.0,0.0,1.0);
      dja::mat3::rotation(&local_a4,&local_b0,(float)(dVar2 * 0.005));
      dja::operator*(&local_80,&local_a4,&g_camera.axis);
      g_camera.axis.m[2].z = local_80.m[2].z;
      g_camera.axis.m[1].y = local_80.m[1].y;
      g_camera.axis.m[1].z = local_80.m[1].z;
      g_camera.axis.m[2].x = local_80.m[2].x;
      g_camera.axis.m[2].y = local_80.m[2].y;
      g_camera.axis.m[0].x = local_80.m[0].x;
      g_camera.axis.m[0].y = local_80.m[0].y;
      g_camera.axis.m[0].z = local_80.m[0].z;
      g_camera.axis.m[1].x = local_80.m[1].x;
      pvVar7 = dja::mat3::operator[]((mat3 *)local_5c,1);
      dja::mat3::rotation(&local_f8,pvVar7,(float)(dVar3 * 0.005));
      dja::operator*(&local_d4,&local_f8,&g_camera.axis);
      g_camera.axis.m[2].z = local_d4.m[2].z;
      g_camera.axis.m[1].y = local_d4.m[1].y;
      g_camera.axis.m[1].z = local_d4.m[1].z;
      g_camera.axis.m[2].x = local_d4.m[2].x;
      g_camera.axis.m[2].y = local_d4.m[2].y;
      g_camera.axis.m[0].x = local_d4.m[0].x;
      g_camera.axis.m[0].y = local_d4.m[0].y;
      g_camera.axis.m[0].z = local_d4.m[0].z;
      g_camera.axis.m[1].x = local_d4.m[1].x;
      pvVar7 = dja::mat3::operator[](&g_camera.axis,0);
      vVar9 = dja::normalize(pvVar7);
      pvVar7 = dja::mat3::operator[](&g_camera.axis,0);
      pvVar7->z = vVar9.z;
      pvVar7->x = (float_t)(int)vVar9._0_8_;
      pvVar7->y = (float_t)(int)((ulong)vVar9._0_8_ >> 0x20);
      pvVar7 = dja::mat3::operator[](&g_camera.axis,1);
      vVar9 = dja::normalize(pvVar7);
      pvVar7 = dja::mat3::operator[](&g_camera.axis,1);
      pvVar7->z = vVar9.z;
      pvVar7->x = (float_t)(int)vVar9._0_8_;
      pvVar7->y = (float_t)(int)((ulong)vVar9._0_8_ >> 0x20);
      pvVar7 = dja::mat3::operator[](&g_camera.axis,2);
      vVar9 = dja::normalize(pvVar7);
      uVar1 = vVar9._0_8_;
      axis_1.m[2]._4_8_ = uVar1;
      pvVar7 = dja::mat3::operator[](&g_camera.axis,2);
      pvVar7->x = (float_t)uVar1;
      pvVar7->y = SUB84(uVar1,4);
      pvVar7->z = vVar9.z;
      dVar4 = x;
      dVar5 = y;
    }
    else {
      iVar6 = glfwGetMouseButton(window,1);
      dVar4 = x;
      dVar5 = y;
      if (iVar6 == 1) {
        dja::transpose((mat3 *)local_17c,&g_camera.axis);
        pvVar7 = dja::mat3::operator[]((mat3 *)local_17c,1);
        vVar9 = dja::operator*(pvVar7,(float)dVar2);
        local_1b8.z = vVar9.z;
        local_1b8._0_8_ = vVar9._0_8_;
        local_1a8._0_8_ = local_1b8._0_8_;
        local_1a8.z = local_1b8.z;
        vVar9 = dja::operator*(&local_1a8,0.005);
        local_1c8.z = vVar9.z;
        local_1c8._0_8_ = vVar9._0_8_;
        local_198._0_8_ = local_1c8._0_8_;
        local_198.z = local_1c8.z;
        fVar8 = dja::norm(&g_camera.pos);
        vVar9 = dja::operator*(&local_198,fVar8);
        local_1d8.z = vVar9.z;
        local_1d8._0_8_ = vVar9._0_8_;
        local_188._0_8_ = local_1d8._0_8_;
        local_188.z = local_1d8.z;
        dja::operator-=(&g_camera.pos,&local_188);
        pvVar7 = dja::mat3::operator[]((mat3 *)local_17c,2);
        vVar9 = dja::operator*(pvVar7,(float)dVar3);
        local_200.z = vVar9.z;
        local_200._0_8_ = vVar9._0_8_;
        vVar9 = dja::operator*(&local_200,0.005);
        local_1f0.z = vVar9.z;
        local_1f0._0_8_ = vVar9._0_8_;
        fVar8 = dja::norm(&g_camera.pos);
        vVar9 = dja::operator*(&local_1f0,fVar8);
        local_1e4.z = vVar9.z;
        local_1e4._0_8_ = vVar9._0_8_;
        dja::operator+=(&g_camera.pos,&local_1e4);
        dVar4 = x;
        dVar5 = y;
      }
    }
  }
  mouseMotionCallback::y0 = dVar5;
  mouseMotionCallback::x0 = dVar4;
  return;
}

Assistant:

void mouseMotionCallback(GLFWwindow* window, double x, double y)
{
    static double x0 = 0, y0 = 0;
    double dx = x - x0,
           dy = y - y0;

    ImGuiIO& io = ImGui::GetIO();
    if (io.WantCaptureMouse)
        return;

    if (glfwGetMouseButton(window, GLFW_MOUSE_BUTTON_LEFT) == GLFW_PRESS) {
        dja::mat3 axis = dja::transpose(g_camera.axis);
        g_camera.axis = dja::mat3::rotation(dja::vec3(0, 0, 1), dx * 5e-3)
                      * g_camera.axis;
        g_camera.axis = dja::mat3::rotation(axis[1], dy * 5e-3)
                      * g_camera.axis;
        g_camera.axis[0] = dja::normalize(g_camera.axis[0]);
        g_camera.axis[1] = dja::normalize(g_camera.axis[1]);
        g_camera.axis[2] = dja::normalize(g_camera.axis[2]);
    } else if (glfwGetMouseButton(window, GLFW_MOUSE_BUTTON_RIGHT) == GLFW_PRESS) {
        dja::mat3 axis = dja::transpose(g_camera.axis);
        g_camera.pos-= axis[1] * dx * 5e-3 * norm(g_camera.pos);
        g_camera.pos+= axis[2] * dy * 5e-3 * norm(g_camera.pos);
    }

    x0 = x;
    y0 = y;
}